

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.hpp
# Opt level: O3

void __thiscall limonp::Logger::~Logger(Logger *this)

{
  ostream *poVar1;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_30,local_28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  if (this->level_ != 4) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::ios_base::~ios_base((ios_base *)&this->field_0x70);
    return;
  }
  abort();
}

Assistant:

~Logger() {
#ifdef LOGGING_LEVEL
     if (level_ < LOGGING_LEVEL) {
       return;
     }
#endif
    std::cerr << stream_.str() << std::endl;
    if (level_ == LL_FATAL) {
      abort();
    }
  }